

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O0

void __thiscall asmjit::_abi_1_10::ZoneBitVector::or_(ZoneBitVector *this,ZoneBitVector *other)

{
  BitWord *pBVar1;
  long lVar2;
  uint nBits;
  uint32_t uVar3;
  long *in_RSI;
  ZoneBitVector *in_RDI;
  uint32_t i;
  uint32_t commonBitWordCount;
  BitWord *src;
  BitWord *dst;
  uint local_28;
  
  pBVar1 = in_RDI->_data;
  lVar2 = *in_RSI;
  nBits = Support::min<unsigned_int>(&in_RDI->_size,(uint *)(in_RSI + 1));
  uVar3 = _wordsPerBits(nBits);
  for (local_28 = 0; local_28 < uVar3; local_28 = local_28 + 1) {
    pBVar1[local_28] = pBVar1[local_28] | *(ulong *)(lVar2 + (ulong)local_28 * 8);
  }
  _clearUnusedBits(in_RDI);
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void or_(const ZoneBitVector& other) noexcept {
    BitWord* dst = _data;
    const BitWord* src = other._data;

    uint32_t commonBitWordCount = _wordsPerBits(Support::min(_size, other._size));
    for (uint32_t i = 0; i < commonBitWordCount; i++)
      dst[i] = dst[i] | src[i];
    _clearUnusedBits();
  }